

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O1

void dsfmt_fill_array_close_open(dsfmt_t *dsfmt,double *array,int size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  
  if ((size & 1U) != 0) {
    __assert_fail("size % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x21e,"void dsfmt_fill_array_close_open(dsfmt_t *, double *, int)");
  }
  if (size < 0x17e) {
    __assert_fail("size >= DSFMT_N64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x21f,"void dsfmt_fill_array_close_open(dsfmt_t *, double *, int)");
  }
  uVar6 = *(ulong *)((long)dsfmt->status + 0xbf8);
  uVar7 = (uVar6 << 0x20 | uVar6 >> 0x20) ^ dsfmt->status[0].u[0] << 0x13 ^ dsfmt->status[0x75].u[0]
  ;
  uVar6 = dsfmt->status[0].u[1];
  uVar11 = (dsfmt->status[0xbf].u[0] << 0x20 | dsfmt->status[0xbf].u[0] >> 0x20) ^ uVar6 << 0x13 ^
           *(ulong *)((long)dsfmt->status + 0x758);
  *array = (double)(uVar7 & 0xffafffffffb3f ^ uVar7 >> 0xc ^ dsfmt->status[0].u[0]);
  array[1] = (double)(uVar11 & 0xffdfffc90fffd ^ uVar11 >> 0xc ^ uVar6);
  lVar12 = 0;
  do {
    uVar6 = *(ulong *)((long)dsfmt->status + lVar12 + 0x10);
    uVar5 = *(ulong *)((long)dsfmt->status + lVar12 + 0x18);
    uVar8 = (uVar11 << 0x20 | uVar11 >> 0x20) ^ uVar6 << 0x13 ^
            *(ulong *)((long)dsfmt->status + lVar12 + 0x760);
    uVar11 = (uVar7 << 0x20 | uVar7 >> 0x20) ^ uVar5 << 0x13 ^
             *(ulong *)((long)dsfmt->status + lVar12 + 0x768);
    *(ulong *)((long)array + lVar12 + 0x10) = uVar8 & 0xffafffffffb3f ^ uVar8 >> 0xc ^ uVar6;
    *(ulong *)((long)array + lVar12 + 0x18) = uVar11 & 0xffdfffc90fffd ^ uVar11 >> 0xc ^ uVar5;
    lVar12 = lVar12 + 0x10;
    uVar7 = uVar8;
  } while (lVar12 != 0x490);
  lVar12 = 0;
  do {
    uVar6 = *(ulong *)((long)dsfmt->status + lVar12 + 0x4a0);
    uVar7 = *(ulong *)((long)dsfmt->status + lVar12 + 0x4a8);
    uVar9 = (uVar11 << 0x20 | uVar11 >> 0x20) ^ uVar6 << 0x13 ^ *(ulong *)((long)array + lVar12);
    uVar11 = (uVar8 << 0x20 | uVar8 >> 0x20) ^ uVar7 << 0x13 ^ *(ulong *)((long)array + lVar12 + 8);
    *(uint64_t *)((long)array + lVar12 + 0x4a0) = uVar9 & 0xffafffffffb3f ^ uVar9 >> 0xc ^ uVar6;
    *(ulong *)((long)array + lVar12 + 0x4a8) = uVar11 & 0xffdfffc90fffd ^ uVar11 >> 0xc ^ uVar7;
    lVar12 = lVar12 + 0x10;
    uVar8 = uVar9;
  } while (lVar12 != 0x750);
  uVar13 = (uint)size >> 1;
  uVar6 = 0xbf;
  if (0x2fc < (uint)size) {
    uVar6 = 0xbf;
    uVar7 = uVar9;
    pdVar15 = array;
    do {
      uVar9 = (uVar11 << 0x20 | uVar11 >> 0x20) ^ (long)*pdVar15 << 0x13 ^ (ulong)pdVar15[0xea];
      uVar11 = (uVar7 << 0x20 | uVar7 >> 0x20) ^ (long)pdVar15[1] << 0x13 ^ (ulong)pdVar15[0xeb];
      pdVar15[0x17e] = (double)(uVar9 & 0xffafffffffb3f ^ uVar9 >> 0xc ^ (ulong)*pdVar15);
      pdVar15[0x17f] = (double)(uVar11 & 0xffdfffc90fffd ^ uVar11 >> 0xc ^ (ulong)pdVar15[1]);
      *pdVar15 = *pdVar15 + -1.0;
      pdVar15[1] = pdVar15[1] + -1.0;
      uVar6 = uVar6 + 1;
      pdVar15 = pdVar15 + 2;
      uVar7 = uVar9;
    } while (uVar13 - 0xbf != uVar6);
  }
  uVar7 = (ulong)uVar13;
  if ((uint)size < 0x2fc) {
    uVar8 = 1;
    if (1 < (int)(0x17e - uVar13)) {
      uVar8 = (ulong)(0x17e - uVar13);
    }
    lVar12 = -0xbf0;
    uVar5 = 0;
    do {
      puVar1 = (undefined8 *)((long)array + lVar12 + uVar7 * 0x10);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)dsfmt->status + lVar12 + 0xbf0);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      uVar5 = uVar5 + 1;
      lVar12 = lVar12 + 0x10;
    } while (uVar8 != uVar5);
  }
  else {
    uVar5 = 0;
  }
  if ((int)uVar6 < (int)uVar13) {
    uVar6 = uVar6 & 0xffffffff;
    lVar14 = uVar7 - uVar6;
    lVar12 = uVar6 * 0x10 + -0xbf0;
    lVar16 = 0;
    uVar10 = uVar9;
    do {
      uVar8 = *(ulong *)((long)array + lVar16 + lVar12);
      uVar3 = *(ulong *)((long)array + lVar16 + uVar6 * 0x10 + -0xbe8);
      uVar9 = (uVar11 << 0x20 | uVar11 >> 0x20) ^ uVar8 << 0x13 ^
              *(ulong *)((long)array + lVar16 + uVar6 * 0x10 + -0x4a0);
      uVar11 = (uVar10 << 0x20 | uVar10 >> 0x20) ^ uVar3 << 0x13 ^
               *(ulong *)((long)array + lVar16 + uVar6 * 0x10 + -0x498);
      *(uint64_t *)((long)array + lVar16 + uVar6 * 0x10) =
           uVar9 & 0xffafffffffb3f ^ uVar9 >> 0xc ^ uVar8;
      *(ulong *)((long)array + lVar16 + uVar6 * 0x10 + 8) =
           uVar11 & 0xffdfffc90fffd ^ uVar11 >> 0xc ^ uVar3;
      puVar2 = (undefined8 *)((long)array + lVar16 + uVar6 * 0x10);
      uVar4 = puVar2[1];
      puVar1 = (undefined8 *)((long)dsfmt->status + lVar16 + uVar5 * 0x10);
      *puVar1 = *puVar2;
      puVar1[1] = uVar4;
      *(double *)((long)array + lVar16 + lVar12) = *(double *)((long)array + lVar16 + lVar12) + -1.0
      ;
      *(double *)((long)array + lVar16 + uVar6 * 0x10 + -0xbe8) =
           *(double *)((long)array + lVar16 + uVar6 * 0x10 + -0xbe8) + -1.0;
      lVar16 = lVar16 + 0x10;
      lVar14 = lVar14 + -1;
      uVar10 = uVar9;
    } while (lVar14 != 0);
  }
  lVar12 = -0xbf0;
  do {
    *(double *)((long)array + lVar12 + uVar7 * 0x10) =
         *(double *)((long)array + lVar12 + uVar7 * 0x10) + -1.0;
    *(double *)((long)array + lVar12 + uVar7 * 0x10 + 8) =
         *(double *)((long)array + lVar12 + uVar7 * 0x10 + 8) + -1.0;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0);
  dsfmt->status[0xbf].u[0] = uVar9;
  *(ulong *)((long)dsfmt->status + 0xbf8) = uVar11;
  return;
}

Assistant:

void dsfmt_fill_array_close_open(dsfmt_t* dsfmt, double array[], int size)
{
	assert(size % 2 == 0);
	assert(size >= DSFMT_N64);
	gen_rand_array_c0o1(dsfmt, (w128_t *)array, size / 2);
}